

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall ctemplate::SectionTemplateNode::~SectionTemplateNode(SectionTemplateNode *this)

{
  NodeList *this_00;
  _List_node_base *p_Var1;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__SectionTemplateNode_00153198;
  this_00 = &this->node_list_;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
  }
  std::__cxx11::string::~string((string *)&this->indentation_);
  std::__cxx11::_List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
  _M_clear(&this_00->
            super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>)
  ;
  std::_Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
  ~_Vector_base(&(this->token_).modvals.
                 super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
               );
  return;
}

Assistant:

SectionTemplateNode::~SectionTemplateNode() {
  VLOG(2) << "Deleting SectionTemplateNode: "
          << string(token_.text, token_.textlen) << " and its subnodes"
          << endl;

  // Need to delete the member of the list because the list is a list
  // of pointers to these instances.
  NodeList::iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    delete (*iter);
  }
  VLOG(2) << "Finished deleting subnodes of SectionTemplateNode: "
          << string(token_.text, token_.textlen) << endl;
}